

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int diff_field(field_s *fieldp,void *str0,void *str1,int nfields)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  if (nfields < 1) {
    return 0;
  }
  iVar5 = 0;
  do {
    uVar1 = fieldp->type;
    if ((int)uVar1 < 0) {
      if (uVar1 == 0xfffff001) goto LAB_0010d2e7;
      if (uVar1 == 0xfffff013) {
        piVar2 = *(int **)((long)str0 + (long)fieldp->offset);
        piVar3 = *(int **)((long)str1 + (long)fieldp->offset);
        if (piVar2 != (int *)0x0 || piVar3 != (int *)0x0) {
          if ((piVar2 != (int *)0x0) != (piVar3 != (int *)0x0)) {
            return 1;
          }
          if (*piVar2 != *piVar3) {
            return 1;
          }
          if (piVar2[1] != piVar3[1]) {
            return 1;
          }
        }
      }
    }
    else if (((uVar1 < 0x11) && ((0x10111U >> (uVar1 & 0x1f) & 1) != 0)) || (uVar1 == 0x100)) {
LAB_0010d2e7:
      iVar6 = fieldp->len * fieldp->size;
      if (0 < iVar6) {
        lVar4 = 0;
        do {
          if (*(char *)((long)str0 + lVar4 + fieldp->offset) !=
              *(char *)((long)str1 + lVar4 + fieldp->offset)) {
            return 1;
          }
          lVar4 = lVar4 + 1;
        } while (iVar6 != (int)lVar4);
      }
    }
    iVar5 = iVar5 + 1;
    fieldp = fieldp + 1;
    if (iVar5 == nfields) {
      return 0;
    }
  } while( true );
}

Assistant:

int diff_field(field_s *fieldp, void * str0, void * str1, int nfields)
{
   field_s * fp;
   char    * cp0, * cp1;
   int       fnum, c, size;

   fp = fieldp;
   for( fnum = 0; fnum < nfields; fnum++, fp++ )
   {
      switch( fp->type ){
         case DT_UNKNOWN:     /* all basic types are easy */
         case DT_INT8:
         case DT_INT16:
         case DT_INT32:
         case DT_FLOAT32:
         case NT_DT_STRING:
            size = fp->size * fp->len;  /* total field size */
            cp0 = (char *)str0 + fp->offset;
            cp1 = (char *)str1 + fp->offset;
            for( c = 0; c < size; c++, cp0++, cp1++ )
               if( *cp0 != *cp1 ) break;

            if(c < size) return 1;  /* found a diff */

            break;

         case NT_DT_POINTER:     /* let's pass on these - no diff */
         case NT_DT_CHAR_PTR:

            break;

         case NT_DT_EXT_PTR:
         {
            nifti1_extension * ext0, * ext1;

            ext0 = *(nifti1_extension **)((char *)str0 + fp->offset);
            ext1 = *(nifti1_extension **)((char *)str1 + fp->offset);

            if( ! ext0 && ! ext1 ) break;     /* continue on */

            if( ext0 && ! ext1 )   return 1;  /* pointer diff is diff */
            if( ! ext0 && ext1 )   return 1;

            /* just check size and type for a single extension */
            if( ext0->esize != ext1->esize ) return 1;
            if( ext0->ecode != ext1->ecode ) return 1;

            break;
         }
      }
   }

   return 0;   /* no diffs found */
}